

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyzer.cpp
# Opt level: O1

void __thiscall
SemanticAnalyzerRun::onExitDeclareStatementAstNode
          (SemanticAnalyzerRun *this,DeclareStatementAstNode *node)

{
  Scope *this_00;
  shared_ptr<Token> local_18;
  
  this_00 = (this->currentScope).super___shared_ptr<Scope,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_18.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (node->identifier).super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_18.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (node->identifier).super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_18.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_18.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_18.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_18.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_18.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
    }
  }
  Scope::define(this_00,&(local_18.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                         value,&local_18,true);
  if (local_18.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_18.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  return;
}

Assistant:

void onExitDeclareStatementAstNode(DeclareStatementAstNode* node) noexcept override {
    this->currentScope->define(node->identifier->value, node->identifier, true);
  }